

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_movl_seg_T0(DisasContext *s,int seg_reg)

{
  TCGContext *tcg_ctx_00;
  TCGv_ptr arg1;
  TCGv_i32 arg2;
  TCGContext *tcg_ctx;
  int seg_reg_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((s->pe == 0) || (s->vm86 != 0)) {
    gen_op_movl_seg_T0_vm(s,seg_reg);
    if (seg_reg == 2) {
      (s->base).is_jmp = DISAS_TOO_MANY;
    }
  }
  else {
    tcg_gen_extrl_i64_i32_x86_64(tcg_ctx_00,s->tmp2_i32,s->T0);
    arg1 = tcg_ctx_00->cpu_env;
    arg2 = tcg_const_i32_x86_64(tcg_ctx_00,seg_reg);
    gen_helper_load_seg(tcg_ctx_00,arg1,arg2,s->tmp2_i32);
    if ((seg_reg == 2) || ((s->code32 != 0 && (seg_reg < 4)))) {
      (s->base).is_jmp = DISAS_TOO_MANY;
    }
  }
  return;
}

Assistant:

static void gen_movl_seg_T0(DisasContext *s, int seg_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    if (s->pe && !s->vm86) {
        tcg_gen_trunc_tl_i32(tcg_ctx, s->tmp2_i32, s->T0);
        gen_helper_load_seg(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, seg_reg), s->tmp2_i32);
        /* abort translation because the addseg value may change or
           because ss32 may change. For R_SS, translation must always
           stop as a special handling must be done to disable hardware
           interrupts for the next instruction */
        if (seg_reg == R_SS || (s->code32 && seg_reg < R_FS)) {
            s->base.is_jmp = DISAS_TOO_MANY;
        }
    } else {
        gen_op_movl_seg_T0_vm(s, seg_reg);
        if (seg_reg == R_SS) {
            s->base.is_jmp = DISAS_TOO_MANY;
        }
    }
}